

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token __thiscall slang::parsing::Lexer::lexDollarSign(Lexer *this)

{
  TokenKind kind;
  Token TVar1;
  undefined1 in_stack_00000038 [16];
  KnownSystemName local_c;
  
  scanIdentifier(this);
  if (*(int *)&this->sourceBuffer - (int)this->marker == 1) {
    kind = Dollar;
  }
  else {
    kind = LexerFacts::getSystemKeywordKind((string_view)in_stack_00000038);
    if (kind == Unknown) {
      local_c = parseKnownSystemName((string_view)in_stack_00000038);
      TVar1 = create<slang::parsing::KnownSystemName>(this,SystemIdentifier,&local_c);
      return TVar1;
    }
  }
  TVar1 = create<>(this,kind);
  return TVar1;
}

Assistant:

Token Lexer::lexDollarSign() {
    scanIdentifier();

    // if length is 1, we just have a dollar sign operator
    if (lexemeLength() == 1)
        return create(TokenKind::Dollar);

    // otherwise, we have a system identifier
    // check for system keywords
    TokenKind kind = LF::getSystemKeywordKind(lexeme());
    if (kind != TokenKind::Unknown)
        return create(kind);

    return create(TokenKind::SystemIdentifier, parseKnownSystemName(lexeme()));
}